

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::updateRowDualImpliedBounds
          (HPresolve *this,HighsInt row,HighsInt col,double val)

{
  double *pdVar1;
  HighsLp *pHVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_40;
  HighsCDouble local_30;
  
  dVar3 = this->primal_feastol;
  if ((this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[col] == 1) {
    dVar3 = -dVar3;
  }
  pHVar2 = this->model;
  dVar5 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  local_40 = -INFINITY;
  if ((dVar5 <= -INFINITY) ||
     (dVar5 + dVar3 <
      (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[col])) {
    local_40 = (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col];
  }
  dVar5 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if ((INFINITY <= dVar5) ||
     (dVar5 = dVar5 - dVar3,
     pdVar1 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + col, *pdVar1 <= dVar5 && dVar5 != *pdVar1)) {
    dVar3 = (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
  }
  else {
    dVar3 = INFINITY;
  }
  dVar5 = (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance * 1000.0;
  if (dVar3 < INFINITY) {
    dVar4 = HighsLinearSumBounds::getResidualSumLowerOrig(&this->impliedDualRowBounds,col,row,val);
    if (-INFINITY < dVar4) {
      local_30.hi = dVar3 - dVar4;
      local_30.lo = (-dVar4 - (local_30.hi - dVar3)) +
                    (dVar3 - (local_30.hi - (local_30.hi - dVar3))) + 0.0;
      HighsCDouble::operator/=(&local_30,val);
      dVar3 = local_30.hi + local_30.lo;
      pdVar1 = &(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
      if (ABS(dVar3) * 1e-14 < *pdVar1 || ABS(dVar3) * 1e-14 == *pdVar1) {
        if (val <= 0.0) {
          if ((this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[row] + dVar5 < dVar3) {
            changeImplRowDualLower(this,row,dVar3,col);
          }
        }
        else if (dVar3 < (this->implRowDualUpper).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[row] - dVar5) {
          changeImplRowDualUpper(this,row,dVar3,col);
        }
      }
    }
  }
  if (-INFINITY < local_40) {
    dVar3 = HighsLinearSumBounds::getResidualSumUpperOrig(&this->impliedDualRowBounds,col,row,val);
    if (dVar3 < INFINITY) {
      local_30.hi = local_40 - dVar3;
      local_30.lo = (-dVar3 - (local_30.hi - local_40)) +
                    (local_40 - (local_30.hi - (local_30.hi - local_40))) + 0.0;
      HighsCDouble::operator/=(&local_30,val);
      dVar3 = local_30.hi + local_30.lo;
      pdVar1 = &(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
      if (ABS(dVar3) * 1e-14 < *pdVar1 || ABS(dVar3) * 1e-14 == *pdVar1) {
        if (0.0 <= val) {
          if (dVar5 + (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[row] < dVar3) {
            changeImplRowDualLower(this,row,dVar3,col);
          }
        }
        else if (dVar3 < (this->implRowDualUpper).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[row] - dVar5) {
          changeImplRowDualUpper(this,row,dVar3,col);
        }
      }
    }
  }
  return;
}

Assistant:

void HPresolve::updateRowDualImpliedBounds(HighsInt row, HighsInt col,
                                           double val) {
  // propagate implied row dual bound
  // if the column has an infinite lower bound the reduced cost cannot be
  // positive, i.e. the column corresponds to a <= constraint in the dual with
  // right hand side -cost which becomes a >= constraint with side +cost.
  // Furthermore, we can ignore strictly redundant primal
  // column bounds and treat them as if they are infinite
  double impliedMargin = colsize[col] != 1 ? primal_feastol : -primal_feastol;
  double dualRowLower =
      (model->col_lower_[col] == -kHighsInf) ||
              (implColLower[col] > model->col_lower_[col] + impliedMargin)
          ? model->col_cost_[col]
          : -kHighsInf;

  double dualRowUpper =
      (model->col_upper_[col] == kHighsInf) ||
              (implColUpper[col] < model->col_upper_[col] - impliedMargin)
          ? model->col_cost_[col]
          : kHighsInf;

  const double threshold = 1000 * options->dual_feasibility_tolerance;

  auto checkImpliedBound = [&](HighsInt row, HighsInt col, double val,
                               double dualRowBnd, double residualAct,
                               HighsInt direction) {
    if (direction * residualAct <= -kHighsInf) return;
    double impliedBound = static_cast<double>(
        (static_cast<HighsCDouble>(dualRowBnd) - residualAct) / val);

    if (std::abs(impliedBound) * kHighsTiny >
        options->dual_feasibility_tolerance)
      return;

    if (direction * val > 0) {
      // only tighten bound if it is tighter by a wide enough margin
      if (impliedBound < implRowDualUpper[row] - threshold)
        changeImplRowDualUpper(row, impliedBound, col);
    } else {
      if (impliedBound > implRowDualLower[row] + threshold)
        changeImplRowDualLower(row, impliedBound, col);
    }
  };

  if (dualRowUpper != kHighsInf)
    checkImpliedBound(
        row, col, val, dualRowUpper,
        impliedDualRowBounds.getResidualSumLowerOrig(col, row, val),
        HighsInt{1});

  if (dualRowLower != -kHighsInf)
    checkImpliedBound(
        row, col, val, dualRowLower,
        impliedDualRowBounds.getResidualSumUpperOrig(col, row, val),
        HighsInt{-1});
}